

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

NOTE_DATA * new_note(void)

{
  NOTE_DATA *note;
  NOTE_DATA *local_8;
  
  if (note_free == (NOTE_DATA *)0x0) {
    local_8 = (NOTE_DATA *)operator_new(0x40);
  }
  else {
    local_8 = note_free;
    note_free = note_free->next;
  }
  local_8->valid = true;
  return local_8;
}

Assistant:

NOTE_DATA *new_note()
{
	NOTE_DATA *note;

	if (note_free == nullptr)
	{
		note = new NOTE_DATA;
	}
	else
	{
		note = note_free;
		note_free = note_free->next;
	}

	note->valid = true;
	return note;
}